

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_glows.cxx
# Opt level: O2

void __thiscall read_glow_v13::operator()(read_glow_v13 *this,glow_data **_glow,xr_reader *r)

{
  uint16_t uVar1;
  float *pfVar2;
  glow_data *v;
  
  v = (glow_data *)operator_new(0x14);
  *_glow = v;
  xray_re::xr_reader::r_fvector3(r,(fvector3 *)v);
  pfVar2 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
  v->radius = *pfVar2;
  (r->field_2).m_p = (uint8_t *)((long)pfVar2 + 6);
  uVar1 = *(uint16_t *)(pfVar2 + 1);
  v->shader_id = uVar1;
  v->texture_id = uVar1;
  return;
}

Assistant:

void operator()(glow_data*& _glow, xr_reader& r) const {
	glow_data* glow = new glow_data;
	_glow = glow;
	r.r_fvector3(glow->position);
	glow->radius = r.r_float();
	glow->texture_id = glow->shader_id = r.r_u16();
}